

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall FileReaderZ::FileReaderZ(FileReaderZ *this,FileReader *file,bool zip)

{
  char *pcVar1;
  FString local_38 [3];
  int local_20;
  byte local_19;
  int err;
  bool zip_local;
  FileReader *file_local;
  FileReaderZ *this_local;
  
  local_19 = zip;
  _err = file;
  file_local = (FileReader *)this;
  FileReaderBase::FileReaderBase(&this->super_FileReaderBase);
  (this->super_FileReaderBase)._vptr_FileReaderBase = (_func_int **)&PTR__FileReaderZ_009f4c90;
  this->File = _err;
  this->SawEOF = false;
  FillBuffer(this);
  (this->Stream).zalloc = (alloc_func)0x0;
  (this->Stream).zfree = (free_func)0x0;
  if ((local_19 & 1) == 0) {
    local_20 = inflateInit_(&this->Stream,"1.2.11",0x70);
  }
  else {
    local_20 = inflateInit2_(&this->Stream,0xfffffff1,"1.2.11",0x70);
  }
  if (local_20 != 0) {
    M_ZLibError((int)local_38);
    pcVar1 = FString::GetChars(local_38);
    I_Error("FileReaderZ: inflateInit failed: %s\n",pcVar1);
    FString::~FString(local_38);
  }
  return;
}

Assistant:

FileReaderZ::FileReaderZ (FileReader &file, bool zip)
: File(file), SawEOF(false)
{
	int err;

	FillBuffer ();

	Stream.zalloc = Z_NULL;
	Stream.zfree = Z_NULL;

	if (!zip) err = inflateInit (&Stream);
	else err = inflateInit2 (&Stream, -MAX_WBITS);

	if (err != Z_OK)
	{
		I_Error ("FileReaderZ: inflateInit failed: %s\n", M_ZLibError(err).GetChars());
	}
}